

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O1

bool __thiscall qpdf::Array::insert(Array *this,int at,QPDFObjectHandle *item)

{
  _Rb_tree_color _Var1;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pQVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  QPDF_Array *pQVar7;
  QPDF_Array *pQVar8;
  _Rb_tree_node_base *p_Var9;
  mapped_type *pmVar10;
  int iVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_> __tmp;
  bool bVar12;
  int key;
  node_type nh;
  int local_80;
  _Rb_tree_color local_7c;
  node_type local_78;
  QPDFObjectHandle *local_60;
  insert_return_type local_58;
  
  local_80 = at;
  pQVar7 = array(this);
  pQVar8 = array(this);
  _Var2._M_head_impl =
       (pQVar8->sp)._M_t.
       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
       super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (Sparse *)0x0) {
    iVar11 = (int)((ulong)((long)(pQVar8->elements).
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pQVar8->elements).
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  else {
    iVar11 = (_Var2._M_head_impl)->size;
  }
  bVar12 = -1 < local_80;
  bVar6 = local_80 <= iVar11;
  if (local_80 <= iVar11 && bVar12) {
    if (local_80 == iVar11) {
      push_back(this,item);
    }
    else {
      checkOwnership(this,item);
      _Var2._M_head_impl =
           (pQVar7->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      if (_Var2._M_head_impl == (Sparse *)0x0) {
        pQVar5 = (pQVar7->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_78.
        super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
        ._M_ptr = (pointer)(item->super_BaseHandle).obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_78._M_pkey =
             (__pointer<int>)
             (item->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count +
                 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey)->_M_use_count +
                 1;
          }
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_insert_rval
                  (&pQVar7->elements,pQVar5 + local_80,(value_type *)&local_78);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_pkey);
        }
      }
      else {
        p_Var9 = (_Rb_tree_node_base *)((long)&(_Var2._M_head_impl)->elements + 8);
        local_60 = item;
        do {
          if (p_Var9 == *(_Base_ptr *)
                         ((long)&((pQVar7->sp)._M_t.
                                  super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                                  .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)
                                 ->elements + 0x18)) break;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var9);
          iVar11 = local_80;
          _Var1 = p_Var9[1]._M_color;
          local_7c = _Var1;
          if ((int)_Var1 < local_80) break;
          std::
          _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::extract(&local_78,
                    &(((pQVar7->sp)._M_t.
                       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                       .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->elements).
                     _M_t,(key_type *)&local_7c);
          *local_78._M_pkey = *local_78._M_pkey + 1;
          std::
          _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::_M_reinsert_node_unique
                    (&local_58,
                     &(((pQVar7->sp)._M_t.
                        super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                        .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->elements)
                      ._M_t,&local_78);
          if (local_58.node.
              super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
              ._M_ptr != (pointer)0x0) {
            std::
            _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
            ::_M_reset(&local_58.node.
                        super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                      );
          }
          if (local_78.
              super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
              ._M_ptr != (pointer)0x0) {
            std::
            _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
            ::_M_reset(&local_78.
                        super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                      );
          }
        } while (iVar11 <= (int)_Var1);
        peVar3 = (local_60->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var4 = (local_60->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        pmVar10 = std::
                  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                  ::operator[](&((pQVar7->sp)._M_t.
                                 super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                                 .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->
                                elements,&local_80);
        (pmVar10->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar3;
        this_00 = (pmVar10->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (pmVar10->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        _Var2._M_head_impl =
             (pQVar7->sp)._M_t.
             super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
             _M_t.
             super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
             super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        (_Var2._M_head_impl)->size = (_Var2._M_head_impl)->size + 1;
      }
    }
  }
  return bVar6 && bVar12;
}

Assistant:

bool
Array::insert(int at, QPDFObjectHandle const& item)
{
    auto a = array();
    int sz = size();
    if (at < 0 || at > sz) {
        // As special case, also allow insert beyond the end
        return false;
    } else if (at == sz) {
        push_back(item);
    } else {
        checkOwnership(item);
        if (a->sp) {
            auto iter = a->sp->elements.crbegin();
            while (iter != a->sp->elements.crend()) {
                auto key = (iter++)->first;
                if (key >= at) {
                    auto nh = a->sp->elements.extract(key);
                    ++nh.key();
                    a->sp->elements.insert(std::move(nh));
                } else {
                    break;
                }
            }
            a->sp->elements[at] = item.getObj();
            ++a->sp->size;
        } else {
            a->elements.insert(a->elements.cbegin() + at, item.getObj());
        }
    }
    return true;
}